

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall wasm::PassRunner::runOnFunction(PassRunner *this,Function *func)

{
  pointer puVar1;
  ostream *poVar2;
  char *in_RCX;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass;
  pointer puVar3;
  Name name;
  
  if ((this->options).debug == true) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[PassRunner] running passes on function ");
    name.super_IString.str._M_str = in_RCX;
    name.super_IString.str._M_len =
         (size_t)(func->super_Importable).super_Named.name.super_IString.str._M_str;
    poVar2 = wasm::operator<<((wasm *)poVar2,
                              (ostream *)
                              (func->super_Importable).super_Named.name.super_IString.str._M_len,
                              name);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  puVar1 = (this->passes).
           super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->passes).
                super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    runPassOnFunction(this,(puVar3->_M_t).
                           super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                           super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                           super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl,func);
  }
  return;
}

Assistant:

void PassRunner::runOnFunction(Function* func) {
  if (options.debug) {
    std::cerr << "[PassRunner] running passes on function " << func->name
              << std::endl;
  }
  for (auto& pass : passes) {
    runPassOnFunction(pass.get(), func);
  }
}